

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_object.hpp
# Opt level: O1

void __thiscall
webfront::http::std::experimental::net::v1::
basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
::basic_io_object(basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
                  *this,io_context *io_context)

{
  resolver_service<std::experimental::net::v1::ip::tcp> *prVar1;
  key local_28;
  
  local_28.type_info_ =
       (type_info *)
       &::std::experimental::net::v1::detail::
        typeid_wrapper<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>>
        ::typeinfo;
  local_28.id_ = (id *)0x0;
  prVar1 = (resolver_service<std::experimental::net::v1::ip::tcp> *)
           detail::service_registry::do_use_service
                     ((io_context->super_execution_context).service_registry_,&local_28,
                      ::std::experimental::net::v1::detail::service_registry::
                      create<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,std::experimental::net::v1::io_context>
                      ,io_context);
  this->service_ = prVar1;
  (this->implementation_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->implementation_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::
  reset<void,std::experimental::net::v1::detail::socket_ops::noop_deleter>
            ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&this->implementation_,0);
  return;
}

Assistant:

explicit basic_io_object(std::experimental::net::v1::io_context& io_context)
    : service_(&std::experimental::net::v1::use_service<IoObjectService>(io_context))
  {
    service_->construct(implementation_);
  }